

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

ModportPortSymbol *
slang::ast::ModportPortSymbol::fromSyntax
          (ASTContext *context,ArgumentDirection direction,ModportNamedPortSyntax *syntax)

{
  Expression *location;
  ModportPortSymbol *this;
  ASTContext *pAVar1;
  bool bVar2;
  bitmask<slang::ast::AssignFlags> flags;
  Compilation *this_00;
  Scope *scope;
  Symbol *pSVar3;
  Diagnostic *pDVar4;
  Type *type;
  DeclaredType *target;
  DeclaredType *this_01;
  size_type delta;
  Expression *this_02;
  LookupLocation LVar5;
  SourceRange SVar6;
  string_view sVar7;
  undefined1 constraintAllowed;
  bitmask<slang::ast::AssignFlags> local_1bc;
  SourceLocation local_1b8;
  SourceLocation local_1b0;
  SourceLocation local_1a8;
  bool local_1a0 [8];
  SourceLocation local_198;
  Expression *local_190;
  Expression *expr;
  SourceLocation loc;
  undefined1 local_178 [8];
  ASTContext checkCtx;
  DeclaredType *sourceType;
  Diagnostic *diag_1;
  Diagnostic *diag;
  SourceRange local_a8;
  Scope *local_98;
  uint32_t local_90;
  Scope *local_88;
  uint32_t local_80;
  string_view local_78;
  SourceLocation local_68;
  string_view local_60;
  ModportPortSymbol *local_50;
  ModportPortSymbol *result;
  Token name;
  Compilation *comp;
  ModportNamedPortSyntax *syntax_local;
  ASTContext *pAStack_18;
  ArgumentDirection direction_local;
  ASTContext *context_local;
  
  syntax_local._4_4_ = direction;
  pAStack_18 = context;
  this_00 = ASTContext::getCompilation(context);
  result = *(ModportPortSymbol **)&syntax->name;
  name._0_8_ = (syntax->name).info;
  local_60 = parsing::Token::valueText((Token *)&result);
  local_68 = parsing::Token::location((Token *)&result);
  local_50 = BumpAllocator::
             emplace<slang::ast::ModportPortSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::ArgumentDirection&>
                       (&this_00->super_BumpAllocator,&local_60,&local_68,
                        (ArgumentDirection *)((long)&syntax_local + 4));
  Symbol::setSyntax((Symbol *)local_50,(SyntaxNode *)syntax);
  scope = not_null<const_slang::ast::Scope_*>::operator*(&pAStack_18->scope);
  local_78 = parsing::Token::valueText((Token *)&result);
  LVar5 = ASTContext::getLocation(pAStack_18);
  local_98 = LVar5.scope;
  local_90 = LVar5.index;
  local_88 = local_98;
  local_80 = local_90;
  local_a8 = parsing::Token::range((Token *)&result);
  bitmask<slang::ast::LookupFlags>::bitmask
            ((bitmask<slang::ast::LookupFlags> *)((long)&diag + 4),NoParentScope);
  LVar5.index = local_80;
  LVar5.scope = local_88;
  constraintAllowed = local_a8.startLoc._0_1_;
  LVar5._12_4_ = 0;
  pSVar3 = Lookup::unqualifiedAt(scope,local_78,LVar5,local_a8,diag._4_4_);
  pAVar1 = pAStack_18;
  local_50->internalSymbol = pSVar3;
  if (local_50->internalSymbol != (Symbol *)0x0) {
    if (local_50->internalSymbol->kind == Subroutine) {
      SVar6 = parsing::Token::range((Token *)&result);
      pDVar4 = ASTContext::addDiag(pAVar1,(DiagCode)0x220006,SVar6);
      sVar7 = parsing::Token::valueText((Token *)&result);
      Diagnostic::operator<<(pDVar4,sVar7);
      Diagnostic::addNote(pDVar4,(DiagCode)0x40001,local_50->internalSymbol->location);
      local_50->internalSymbol = (Symbol *)0x0;
    }
    else {
      bVar2 = SemanticFacts::isAllowedInModport(local_50->internalSymbol->kind);
      pAVar1 = pAStack_18;
      if (!bVar2) {
        SVar6 = parsing::Token::range((Token *)&result);
        pDVar4 = ASTContext::addDiag(pAVar1,(DiagCode)0x6a0006,SVar6);
        sVar7 = parsing::Token::valueText((Token *)&result);
        Diagnostic::operator<<(pDVar4,sVar7);
        Diagnostic::addNote(pDVar4,(DiagCode)0x40001,local_50->internalSymbol->location);
        local_50->internalSymbol = (Symbol *)0x0;
      }
    }
  }
  this = local_50;
  if (local_50->internalSymbol == (Symbol *)0x0) {
    type = Compilation::getErrorType(this_00);
    ValueSymbol::setType(&this->super_ValueSymbol,type);
    context_local = (ASTContext *)local_50;
  }
  else {
    target = Symbol::getDeclaredType(local_50->internalSymbol);
    if (target == (DeclaredType *)0x0) {
      assert::assertFailed
                ("sourceType",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                 ,0xbd,
                 "static ModportPortSymbol &slang::ast::ModportPortSymbol::fromSyntax(const ASTContext &, ArgumentDirection, const ModportNamedPortSyntax &)"
                );
    }
    checkCtx.assertionInstance =
         (AssertionInstanceDetails *)ValueSymbol::getDeclaredType(&local_50->super_ValueSymbol);
    this_01 = not_null<slang::ast::DeclaredType_*>::operator->
                        ((not_null<slang::ast::DeclaredType_*> *)&checkCtx.assertionInstance);
    DeclaredType::setLink(this_01,target);
    pAVar1 = pAStack_18;
    if (syntax_local._4_4_ != In) {
      bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&loc,NonProcedural);
      ASTContext::resetFlags((ASTContext *)local_178,pAVar1,(bitmask<slang::ast::ASTFlags>)loc);
      local_1a8 = (local_50->super_ValueSymbol).super_Symbol.location;
      pSVar3 = local_50->internalSymbol;
      expr = (Expression *)local_1a8;
      delta = std::basic_string_view<char,_std::char_traits<char>_>::length
                        (&(local_50->super_ValueSymbol).super_Symbol.name);
      local_1b0 = SourceLocation::operator+((SourceLocation *)&expr,delta);
      SourceRange::SourceRange((SourceRange *)local_1a0,local_1a8,local_1b0);
      SVar6.endLoc = (SourceLocation)0x0;
      SVar6.startLoc = local_198;
      this_02 = ValueExpressionBase::fromSymbol
                          ((ValueExpressionBase *)local_178,(ASTContext *)pSVar3,(Symbol *)0x0,
                           local_1a0[0],SVar6,(bool)constraintAllowed);
      location = expr;
      local_190 = this_02;
      switch(syntax_local._4_4_) {
      case Out:
        local_1b8 = (SourceLocation)expr;
        bitmask<slang::ast::AssignFlags>::bitmask(&local_1bc,ModportConn);
        Expression::requireLValue
                  (this_02,(ASTContext *)local_178,local_1b8,local_1bc,(Expression *)0x0,
                   (EvalContext *)0x0);
        break;
      case InOut:
        flags = ast::operator|(ModportConn,InOutPort);
        Expression::requireLValue
                  (this_02,(ASTContext *)local_178,(SourceLocation)location,flags,(Expression *)0x0,
                   (EvalContext *)0x0);
        break;
      case Ref:
        bVar2 = Expression::canConnectToRefArg(this_02,false,false);
        if (!bVar2) {
          pDVar4 = ASTContext::addDiag((ASTContext *)local_178,(DiagCode)0x590007,
                                       (SourceLocation)expr);
          Diagnostic::operator<<(pDVar4,local_190->sourceRange);
        }
      }
    }
    context_local = (ASTContext *)local_50;
  }
  return (ModportPortSymbol *)context_local;
}

Assistant:

ModportPortSymbol& ModportPortSymbol::fromSyntax(const ASTContext& context,
                                                 ArgumentDirection direction,
                                                 const ModportNamedPortSyntax& syntax) {
    auto& comp = context.getCompilation();
    auto name = syntax.name;
    auto result = comp.emplace<ModportPortSymbol>(name.valueText(), name.location(), direction);
    result->setSyntax(syntax);
    result->internalSymbol = Lookup::unqualifiedAt(*context.scope, name.valueText(),
                                                   context.getLocation(), name.range(),
                                                   LookupFlags::NoParentScope);

    if (result->internalSymbol) {
        if (result->internalSymbol->kind == SymbolKind::Subroutine) {
            auto& diag = context.addDiag(diag::ExpectedImportExport, name.range());
            diag << name.valueText();
            diag.addNote(diag::NoteDeclarationHere, result->internalSymbol->location);
            result->internalSymbol = nullptr;
        }
        else if (!SemanticFacts::isAllowedInModport(result->internalSymbol->kind)) {
            auto& diag = context.addDiag(diag::NotAllowedInModport, name.range());
            diag << name.valueText();
            diag.addNote(diag::NoteDeclarationHere, result->internalSymbol->location);
            result->internalSymbol = nullptr;
        }
    }

    if (!result->internalSymbol) {
        result->setType(comp.getErrorType());
        return *result;
    }

    auto sourceType = result->internalSymbol->getDeclaredType();
    ASSERT(sourceType);
    result->getDeclaredType()->setLink(*sourceType);

    // Perform checking on the connected symbol to make sure it's allowed
    // given the modport's direction.
    if (direction != ArgumentDirection::In) {
        ASTContext checkCtx = context.resetFlags(ASTFlags::NonProcedural);

        auto loc = result->location;
        auto& expr = ValueExpressionBase::fromSymbol(checkCtx, *result->internalSymbol, false,
                                                     {loc, loc + result->name.length()});

        switch (direction) {
            case ArgumentDirection::In:
                // unreachable
                break;
            case ArgumentDirection::Out:
                expr.requireLValue(checkCtx, loc, AssignFlags::ModportConn);
                break;
            case ArgumentDirection::InOut:
                expr.requireLValue(checkCtx, loc,
                                   AssignFlags::ModportConn | AssignFlags::InOutPort);
                break;
            case ArgumentDirection::Ref:
                if (!expr.canConnectToRefArg(/* isConstRef */ false))
                    checkCtx.addDiag(diag::InvalidRefArg, loc) << expr.sourceRange;
                break;
        }
    }

    return *result;
}